

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMaterial(FBXConverter *this,Material *material,MeshGeometry *mesh)

{
  aiMaterial *props_00;
  bool bVar1;
  aiMaterial *paVar2;
  size_type sVar3;
  mapped_type_conflict3 *pmVar4;
  string *psVar5;
  long lVar6;
  TextureMap *pTVar7;
  LayeredTextureMap *layeredTextures;
  aiShadingMode local_4b4;
  string local_4b0 [4];
  aiShadingMode shadingMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  string name;
  aiString str;
  aiMaterial *local_30;
  aiMaterial *out_mat;
  PropertyTable *props;
  MeshGeometry *mesh_local;
  Material *material_local;
  FBXConverter *this_local;
  
  props = (PropertyTable *)mesh;
  mesh_local = (MeshGeometry *)material;
  material_local = (Material *)this;
  out_mat = (aiMaterial *)FBX::Material::Props(material);
  paVar2 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar2);
  local_30 = paVar2;
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
  str.data._1016_8_ = mesh_local;
  pmVar4 = std::
           map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
           ::operator[](&this->materials_converted,(key_type *)(str.data + 0x3f8));
  *pmVar4 = (mapped_type_conflict3)sVar3;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&this->materials,&local_30);
  aiString::aiString((aiString *)((long)&name.field_2 + 0xc));
  psVar5 = FBX::Object::Name_abi_cxx11_((Object *)mesh_local);
  std::__cxx11::string::string((string *)local_470,(string *)psVar5);
  std::__cxx11::string::substr((ulong)&local_490,(ulong)local_470);
  bVar1 = std::operator==(&local_490,"Material::");
  std::__cxx11::string::~string((string *)&local_490);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_4b0,(ulong)local_470);
    std::__cxx11::string::operator=((string *)local_470,local_4b0);
    std::__cxx11::string::~string(local_4b0);
  }
  lVar6 = std::__cxx11::string::length();
  if (lVar6 != 0) {
    aiString::Set((aiString *)((long)&name.field_2 + 0xc),(string *)local_470);
    aiMaterial::AddProperty(local_30,(aiString *)((long)&name.field_2 + 0xc),"?mat.name",0,0);
  }
  psVar5 = FBX::Material::GetShadingModel_abi_cxx11_((Material *)mesh_local);
  bVar1 = std::operator==(psVar5,"phong");
  if (bVar1) {
    local_4b4 = aiShadingMode_Phong;
    aiMaterial::AddProperty<aiShadingMode>(local_30,&local_4b4,1,"$mat.shadingm",0,0);
  }
  SetShadingPropertiesCommon(this,local_30,(PropertyTable *)out_mat);
  props_00 = out_mat;
  paVar2 = local_30;
  pTVar7 = FBX::Material::Textures_abi_cxx11_((Material *)mesh_local);
  SetShadingPropertiesRaw(this,paVar2,(PropertyTable *)props_00,pTVar7,(MeshGeometry *)props);
  paVar2 = local_30;
  pTVar7 = FBX::Material::Textures_abi_cxx11_((Material *)mesh_local);
  SetTextureProperties(this,paVar2,pTVar7,(MeshGeometry *)props);
  paVar2 = local_30;
  layeredTextures = FBX::Material::LayeredTextures_abi_cxx11_((Material *)mesh_local);
  SetTextureProperties(this,paVar2,layeredTextures,(MeshGeometry *)props);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
  std::__cxx11::string::~string((string *)local_470);
  return (int)sVar3 - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMaterial(const Material& material, const MeshGeometry* const mesh)
        {
            const PropertyTable& props = material.Props();

            // generate empty output material
            aiMaterial* out_mat = new aiMaterial();
            materials_converted[&material] = static_cast<unsigned int>(materials.size());

            materials.push_back(out_mat);

            aiString str;

            // strip Material:: prefix
            std::string name = material.Name();
            if (name.substr(0, 10) == "Material::") {
                name = name.substr(10);
            }

            // set material name if not empty - this could happen
            // and there should be no key for it in this case.
            if (name.length()) {
                str.Set(name);
                out_mat->AddProperty(&str, AI_MATKEY_NAME);
            }

            // Set the shading mode as best we can: The FBX specification only mentions Lambert and Phong, and only Phong is mentioned in Assimp's aiShadingMode enum.
            if (material.GetShadingModel() == "phong")
            {
                aiShadingMode shadingMode = aiShadingMode_Phong;
                out_mat->AddProperty<aiShadingMode>(&shadingMode, 1, AI_MATKEY_SHADING_MODEL);               
            }

            // shading stuff and colors
            SetShadingPropertiesCommon(out_mat, props);
            SetShadingPropertiesRaw( out_mat, props, material.Textures(), mesh );

            // texture assignments
            SetTextureProperties(out_mat, material.Textures(), mesh);
            SetTextureProperties(out_mat, material.LayeredTextures(), mesh);

            return static_cast<unsigned int>(materials.size() - 1);
        }